

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_plane.cpp
# Opt level: O0

void R_CalcTiltedLighting(double lval,double lend,int width)

{
  BYTE *pBVar1;
  fixed_t fVar2;
  int iVar3;
  int32_t iVar4;
  double dVar5;
  double dVar6;
  BYTE *clight;
  int i;
  BYTE *basecolormapdata;
  BYTE *lightfiller;
  double lstep;
  double dStack_18;
  int width_local;
  double lend_local;
  double lval_local;
  
  iVar3 = planeshade;
  pBVar1 = basecolormap->Maps;
  clight._4_4_ = 0;
  lstep._4_4_ = width;
  if (width != 0) {
    if ((lval != lend) || (NAN(lval) || NAN(lend))) {
      dVar5 = (lend - lval) / (double)width;
      lend_local = lval;
      if (24.0 <= lval) {
        dVar6 = MIN<double>(24.0,lval);
        fVar2 = FloatToFixed(dVar6);
        iVar3 = clamp<int>(iVar3 - fVar2 >> 0x10,0,0x1f);
        basecolormapdata = pBVar1 + (iVar3 << 8);
        for (; clight._4_4_ <= width && 24.0 <= lend_local; clight._4_4_ = clight._4_4_ + 1) {
          tiltlighting[clight._4_4_] = basecolormapdata;
          lend_local = dVar5 + lend_local;
        }
      }
      iVar3 = planeshade;
      dStack_18 = lend;
      if (24.0 <= lend) {
        dVar6 = MIN<double>(24.0,lend);
        fVar2 = FloatToFixed(dVar6);
        iVar3 = clamp<int>(iVar3 - fVar2 >> 0x10,0,0x1f);
        basecolormapdata = pBVar1 + (iVar3 << 8);
        for (; clight._4_4_ < lstep._4_4_ && 24.0 <= dStack_18; lstep._4_4_ = lstep._4_4_ + -1) {
          tiltlighting[lstep._4_4_] = basecolormapdata;
          dStack_18 = dStack_18 - dVar5;
        }
      }
      if (0 < lstep._4_4_) {
        dVar5 = FixedToFloat(planeshade);
        lend_local = dVar5 - lend_local;
        dVar5 = FixedToFloat(planeshade);
        dVar5 = ((dVar5 - dStack_18) - lend_local) / (double)lstep._4_4_;
        if (0.0 <= dVar5) {
          if (lend_local < 31.0) {
            for (; lend_local < 0.0 && clight._4_4_ <= lstep._4_4_; lend_local = dVar5 + lend_local)
            {
              tiltlighting[clight._4_4_] = pBVar1;
              clight._4_4_ = clight._4_4_ + 1;
            }
            if (lstep._4_4_ < clight._4_4_) {
              return;
            }
            for (; clight._4_4_ <= lstep._4_4_ && lend_local < 31.0; lend_local = dVar5 + lend_local
                ) {
              iVar4 = xs_ToInt((real64)lend_local,-0.499999985);
              tiltlighting[clight._4_4_] = pBVar1 + (iVar4 << 8);
              clight._4_4_ = clight._4_4_ + 1;
            }
          }
          basecolormapdata = pBVar1 + 0x1f00;
        }
        else {
          basecolormapdata = pBVar1;
          if (1.0 <= lend_local) {
            if (32.0 <= lend_local) {
              for (; 32.0 <= lend_local && clight._4_4_ <= lstep._4_4_;
                  lend_local = dVar5 + lend_local) {
                tiltlighting[clight._4_4_] = pBVar1 + 0x1f00;
                clight._4_4_ = clight._4_4_ + 1;
              }
              if (lstep._4_4_ < clight._4_4_) {
                return;
              }
            }
            for (; clight._4_4_ <= lstep._4_4_ && 0.0 <= lend_local; lend_local = dVar5 + lend_local
                ) {
              iVar4 = xs_ToInt((real64)lend_local,-0.499999985);
              tiltlighting[clight._4_4_] = pBVar1 + (iVar4 << 8);
              clight._4_4_ = clight._4_4_ + 1;
            }
          }
        }
      }
      goto LAB_0039273e;
    }
  }
  dVar5 = MIN<double>(24.0,lval);
  fVar2 = FloatToFixed(dVar5);
  iVar3 = clamp<int>(iVar3 - fVar2 >> 0x10,0,0x1f);
  basecolormapdata = pBVar1 + (iVar3 << 8);
LAB_0039273e:
  for (; clight._4_4_ <= lstep._4_4_; clight._4_4_ = clight._4_4_ + 1) {
    tiltlighting[clight._4_4_] = basecolormapdata;
  }
  return;
}

Assistant:

void R_CalcTiltedLighting (double lval, double lend, int width)
{
	double lstep;
	BYTE *lightfiller;
	BYTE *basecolormapdata = basecolormap->Maps;
	int i = 0;

	if (width == 0 || lval == lend)
	{ // Constant lighting
		lightfiller = basecolormapdata + (GETPALOOKUP(lval, planeshade) << COLORMAPSHIFT);
	}
	else
	{
		lstep = (lend - lval) / width;
		if (lval >= MAXLIGHTVIS)
		{ // lval starts "too bright".
			lightfiller = basecolormapdata + (GETPALOOKUP(lval, planeshade) << COLORMAPSHIFT);
			for (; i <= width && lval >= MAXLIGHTVIS; ++i)
			{
				tiltlighting[i] = lightfiller;
				lval += lstep;
			}
		}
		if (lend >= MAXLIGHTVIS)
		{ // lend ends "too bright".
			lightfiller = basecolormapdata + (GETPALOOKUP(lend, planeshade) << COLORMAPSHIFT);
			for (; width > i && lend >= MAXLIGHTVIS; --width)
			{
				tiltlighting[width] = lightfiller;
				lend -= lstep;
			}
		}
		if (width > 0)
		{
			lval = FIXED2DBL(planeshade) - lval;
			lend = FIXED2DBL(planeshade) - lend;
			lstep = (lend - lval) / width;
			if (lstep < 0)
			{ // Going from dark to light
				if (lval < 1.)
				{ // All bright
					lightfiller = basecolormapdata;
				}
				else
				{
					if (lval >= NUMCOLORMAPS)
					{ // Starts beyond the dark end
						BYTE *clight = basecolormapdata + ((NUMCOLORMAPS-1) << COLORMAPSHIFT);
						while (lval >= NUMCOLORMAPS && i <= width)
						{
							tiltlighting[i++] = clight;
							lval += lstep;
						}
						if (i > width)
							return;
					}
					while (i <= width && lval >= 0)
					{
						tiltlighting[i++] = basecolormapdata + (xs_ToInt(lval) << COLORMAPSHIFT);
						lval += lstep;
					}
					lightfiller = basecolormapdata;
				}
			}
			else
			{ // Going from light to dark
				if (lval >= (NUMCOLORMAPS-1))
				{ // All dark
					lightfiller = basecolormapdata + ((NUMCOLORMAPS-1) << COLORMAPSHIFT);
				}
				else
				{
					while (lval < 0 && i <= width)
					{
						tiltlighting[i++] = basecolormapdata;
						lval += lstep;
					}
					if (i > width)
						return;
					while (i <= width && lval < (NUMCOLORMAPS-1))
					{
						tiltlighting[i++] = basecolormapdata + (xs_ToInt(lval) << COLORMAPSHIFT);
						lval += lstep;
					}
					lightfiller = basecolormapdata + ((NUMCOLORMAPS-1) << COLORMAPSHIFT);
				}
			}
		}
	}
	for (; i <= width; i++)
	{
		tiltlighting[i] = lightfiller;
	}
}